

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00721a18 == '\x01') {
    DAT_00721a18 = '\0';
    (*(code *)*_StringToInt64Map_default_instance_)();
  }
  if (DAT_00721a90 == '\x01') {
    DAT_00721a90 = '\0';
    (*(code *)*_Int64ToStringMap_default_instance_)();
  }
  if (DAT_00721b08 == '\x01') {
    DAT_00721b08 = '\0';
    (*(code *)*_StringToDoubleMap_default_instance_)();
  }
  if (DAT_00721b80 == '\x01') {
    DAT_00721b80 = '\0';
    (*(code *)*_Int64ToDoubleMap_default_instance_)();
  }
  if (DAT_00721bb8 == '\x01') {
    DAT_00721bb8 = '\0';
    (*(code *)*_StringVector_default_instance_)();
  }
  if (DAT_00721be8 == '\x01') {
    DAT_00721be8 = '\0';
    (*(code *)*_Int64Vector_default_instance_)();
  }
  if (DAT_00721c18 == '\x01') {
    DAT_00721c18 = '\0';
    (*(code *)*_FloatVector_default_instance_)();
  }
  if (DAT_00721c48 == '\x01') {
    DAT_00721c48 = '\0';
    (*(code *)*_DoubleVector_default_instance_)();
  }
  if (DAT_00721c78 == '\x01') {
    DAT_00721c78 = '\0';
    (*(code *)*_Int64Range_default_instance_)();
  }
  if (DAT_00721ca8 == '\x01') {
    DAT_00721ca8 = '\0';
    (*(code *)*_Int64Set_default_instance_)();
  }
  if (DAT_00721cd8 == '\x01') {
    DAT_00721cd8 = 0;
    (*(code *)*_DoubleRange_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _StringToInt64Map_default_instance_.Shutdown();
  _Int64ToStringMap_default_instance_.Shutdown();
  _StringToDoubleMap_default_instance_.Shutdown();
  _Int64ToDoubleMap_default_instance_.Shutdown();
  _StringVector_default_instance_.Shutdown();
  _Int64Vector_default_instance_.Shutdown();
  _FloatVector_default_instance_.Shutdown();
  _DoubleVector_default_instance_.Shutdown();
  _Int64Range_default_instance_.Shutdown();
  _Int64Set_default_instance_.Shutdown();
  _DoubleRange_default_instance_.Shutdown();
}